

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::process_files(crunch *this,file_desc_vec *files)

{
  command_line_params *this_00;
  uint uVar1;
  file_desc *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  format fVar7;
  int iVar8;
  convert_status cVar9;
  ssize_t sVar10;
  char *pcVar11;
  dynamic_string *pdVar12;
  ulong uVar13;
  size_t __nbytes;
  format fVar14;
  uint32 file_index;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  format local_170;
  long local_168;
  dynamic_string out_name;
  dynamic_string out_dir;
  dynamic_string fmt;
  dynamic_string out_ext;
  dynamic_string in_fname;
  dynamic_string in_path;
  dynamic_string in_drive;
  dynamic_string in_ext;
  dynamic_string out_filename;
  byte local_b6;
  cfile_stream in_stream;
  
  this_00 = &this->m_params;
  bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"compare",0,false);
  bVar4 = crnlib::command_line_params::get_value_as_bool(this_00,"info",0,false);
  local_168 = 8;
  for (uVar13 = 0; uVar1 = files->m_size, uVar13 < uVar1; uVar13 = uVar13 + 1) {
    pfVar2 = files->m_p;
    in_drive.m_buf_size = 0;
    in_drive.m_len = 0;
    in_drive.m_pStr = (char *)0x0;
    in_path.m_buf_size = 0;
    in_path.m_len = 0;
    in_path.m_pStr = (char *)0x0;
    in_fname.m_buf_size = 0;
    in_fname.m_len = 0;
    in_fname.m_pStr = (char *)0x0;
    in_ext.m_buf_size = 0;
    in_ext.m_len = 0;
    in_ext.m_pStr = (char *)0x0;
    pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
    if (pcVar15 == (char *)0x0) {
      pcVar15 = "";
    }
    crnlib::file_utils::split_path(pcVar15,&in_drive,&in_path,&in_fname,&in_ext);
    fmt.m_buf_size = 0;
    fmt.m_len = 0;
    fmt.m_pStr = (char *)0x0;
    bVar5 = crnlib::command_line_params::get_value_as_string(this_00,"fileformat",0,&fmt,0);
    fVar14 = cFormatCRN;
    if (bVar5) {
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"tga");
      fVar14 = cFormatTGA;
      if (bVar5) goto LAB_0010967d;
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"bmp");
      fVar14 = cFormatBMP;
      if (bVar5) goto LAB_0010967d;
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"dds");
      fVar14 = cFormatDDS;
      if (bVar5) goto LAB_0010967d;
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"ktx");
      fVar14 = cFormatKTX;
      if (bVar5) goto LAB_0010967d;
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"crn");
      fVar14 = cFormatCRN;
      if (bVar5) goto LAB_0010967d;
      bVar5 = crnlib::dynamic_string::operator==(&fmt,"png");
      fVar14 = cFormatPNG;
      if (bVar5) goto LAB_0010967d;
      pcVar15 = fmt.m_pStr;
      if (fmt.m_pStr == (char *)0x0) {
        pcVar15 = "";
      }
      crnlib::console::error("Unsupported output file type: %s",pcVar15);
      bVar5 = true;
    }
    else {
LAB_0010967d:
      bVar5 = crnlib::command_line_params::has_key(this_00,"fileformat");
      local_170 = fVar14;
      if (!bVar5) {
        bVar5 = crnlib::command_line_params::has_key(this_00,"split");
        local_170 = cFormatPNG;
        if (!bVar5) {
          pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
          if (pcVar15 == (char *)0x0) {
            pcVar15 = "";
          }
          fVar7 = crnlib::texture_file_types::determine_file_format(pcVar15);
          if (fVar7 == cFormatKTX) {
            local_170 = cFormatPNG;
          }
          else {
            local_170 = fVar14;
            if (fVar7 == cFormatCRN) {
              crnlib::cfile_stream::cfile_stream(&in_stream);
              pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
              if (pcVar15 == (char *)0x0) {
                pcVar15 = "";
              }
              __nbytes = 0;
              iVar8 = crnlib::cfile_stream::open(&in_stream,pcVar15,5);
              local_170 = cFormatDDS;
              if (((char)iVar8 != '\0') &&
                 (sVar10 = crnlib::cfile_stream::read
                                     (&in_stream,(int)&out_filename,(void *)0x4a,__nbytes),
                 (int)sVar10 == 0x4a)) {
                local_170 = (uint)(local_b6 - 10 < 5) * 2;
              }
              crnlib::cfile_stream::~cfile_stream(&in_stream);
            }
          }
        }
      }
      out_filename.m_buf_size = 0;
      out_filename.m_len = 0;
      out_filename.m_pStr = (char *)0x0;
      bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"outsamedir",0,false);
      pcVar16 = in_drive.m_pStr;
      pcVar17 = in_path.m_pStr;
      pcVar15 = in_fname.m_pStr;
      if (bVar5) {
        pcVar11 = crnlib::texture_file_types::get_extension(local_170);
        if (pcVar15 == (char *)0x0) {
          pcVar15 = "";
        }
        if (pcVar17 == (char *)0x0) {
          pcVar17 = "";
        }
        if (pcVar16 == (char *)0x0) {
          pcVar16 = "";
        }
        crnlib::dynamic_string::format(&out_filename,"%s%s%s.%s",pcVar16,pcVar17,pcVar15,pcVar11);
      }
      else {
        bVar5 = crnlib::command_line_params::has_key(this_00,"out");
        if (bVar5) {
          pdVar12 = crnlib::command_line_params::get_value_as_string_or_empty(this_00,"out",0,0);
          crnlib::dynamic_string::operator=(&out_filename,pdVar12);
          if (1 < files->m_size) {
            in_stream.super_data_stream._vptr_data_stream._0_4_ = 0;
            in_stream.super_data_stream.m_name.m_buf_size = 0;
            in_stream.super_data_stream.m_name.m_len = 0;
            in_stream.super_data_stream.m_name._4_4_ = 0;
            out_dir.m_buf_size = 0;
            out_dir.m_len = 0;
            out_dir.m_pStr = (char *)0x0;
            out_name.m_buf_size = 0;
            out_name.m_len = 0;
            out_name.m_pStr = (char *)0x0;
            out_ext.m_buf_size = 0;
            out_ext.m_len = 0;
            out_ext.m_pStr = (char *)0x0;
            pcVar15 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::file_utils::split_path
                      (pcVar15,(dynamic_string *)&in_stream,&out_dir,&out_name,&out_ext);
            pcVar15 = out_name.m_pStr;
            if (out_name.m_pStr == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::dynamic_string::format(&out_name,"%s_%u",pcVar15,uVar13);
            pcVar15 = (char *)in_stream.super_data_stream.m_name._0_8_;
            if (in_stream.super_data_stream.m_name._0_8_ == 0) {
              pcVar15 = "";
            }
            pcVar17 = out_dir.m_pStr;
            if (out_dir.m_pStr == (char *)0x0) {
              pcVar17 = "";
            }
            pcVar16 = out_name.m_pStr;
            if (out_name.m_pStr == (char *)0x0) {
              pcVar16 = "";
            }
            pcVar11 = out_ext.m_pStr;
            if (out_ext.m_pStr == (char *)0x0) {
              pcVar11 = "";
            }
            crnlib::dynamic_string::format(&out_filename,"%s%s%s%s",pcVar15,pcVar17,pcVar16,pcVar11)
            ;
            crnlib::dynamic_string::~dynamic_string(&out_ext);
            crnlib::dynamic_string::~dynamic_string(&out_name);
            crnlib::dynamic_string::~dynamic_string(&out_dir);
            crnlib::dynamic_string::~dynamic_string((dynamic_string *)&in_stream);
          }
          bVar5 = crnlib::command_line_params::has_key(this_00,"fileformat");
          if (!bVar5) {
            pcVar15 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar15 = "";
            }
            local_170 = crnlib::texture_file_types::determine_file_format(pcVar15);
          }
        }
        else {
          pdVar12 = crnlib::command_line_params::get_value_as_string_or_empty(this_00,"outdir",0,0);
          crnlib::dynamic_string::dynamic_string((dynamic_string *)&in_stream,pdVar12);
          bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"recreate",0,false);
          if ((bVar5) && (*(short *)((long)&(pfVar2->m_base).m_pStr + local_168 + 2) != 0)) {
            pcVar15 = (char *)in_stream.super_data_stream.m_name._0_8_;
            if (in_stream.super_data_stream.m_name._0_8_ == 0) {
              pcVar15 = "";
            }
            pcVar17 = *(char **)((long)&(pfVar2->m_rel).m_buf_size + local_168);
            if (pcVar17 == (char *)0x0) {
              pcVar17 = "";
            }
            crnlib::file_utils::combine_path((dynamic_string *)&in_stream,pcVar15,pcVar17);
          }
          pcVar15 = in_fname.m_pStr;
          if (in_stream.super_data_stream._vptr_data_stream._2_2_ == 0) {
            crnlib::texture_file_types::get_extension(local_170);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::dynamic_string::format(&out_filename,"%s.%s",pcVar15);
          }
          else {
            bVar5 = crnlib::file_utils::is_path_separator
                              (*(char *)(in_stream.super_data_stream.m_name._0_8_ +
                                        (ulong)(in_stream.super_data_stream._vptr_data_stream._2_2_
                                               - 1)));
            pcVar15 = (char *)in_stream.super_data_stream.m_name._0_8_;
            if (bVar5) {
              crnlib::texture_file_types::get_extension(local_170);
              pcVar17 = "%s%s.%s";
            }
            else {
              crnlib::texture_file_types::get_extension(local_170);
              pcVar17 = "%s\\%s.%s";
            }
            if (pcVar15 == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::dynamic_string::format(&out_filename,pcVar17,pcVar15);
          }
          bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"recreate",0,false);
          if ((bVar5) &&
             (bVar5 = crnlib::file_utils::full_path(&out_filename), bVar5 && (!bVar3 && !bVar4))) {
            out_dir.m_buf_size = 0;
            out_dir.m_len = 0;
            out_dir.m_pStr = (char *)0x0;
            out_name.m_buf_size = 0;
            out_name.m_len = 0;
            out_name.m_pStr = (char *)0x0;
            pcVar15 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::file_utils::split_path
                      (pcVar15,&out_dir,&out_name,(dynamic_string *)0x0,(dynamic_string *)0x0);
            crnlib::dynamic_string::append(&out_dir,&out_name);
            pcVar15 = out_dir.m_pStr;
            if (out_dir.m_pStr == (char *)0x0) {
              pcVar15 = "";
            }
            crnlib::dynamic_string::dynamic_string(&out_ext,pcVar15);
            crnlib::file_utils::create_path(&out_ext);
            crnlib::dynamic_string::~dynamic_string(&out_ext);
            crnlib::dynamic_string::~dynamic_string(&out_name);
            crnlib::dynamic_string::~dynamic_string(&out_dir);
          }
          crnlib::dynamic_string::~dynamic_string((dynamic_string *)&in_stream);
        }
      }
      if (bVar3 || bVar4) {
LAB_00109c1a:
        file_index = (uint32)uVar13;
        if (bVar4) {
          pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
          if (pcVar15 == (char *)0x0) {
            pcVar15 = "";
          }
          cVar9 = display_file_info(this,file_index,files->m_size,pcVar15);
LAB_00109cec:
          this->m_num_processed = this->m_num_processed + 1;
          bVar5 = true;
          if (cVar9 != cCSBadParam) {
            if (cVar9 == cCSSkipped) {
              crnlib::console::info("Skipping file.\n");
              this->m_num_skipped = this->m_num_skipped + 1;
            }
            else {
              if (cVar9 != cCSSucceeded) goto LAB_00109d2a;
              crnlib::console::info("");
              this->m_num_succeeded = this->m_num_succeeded + 1;
            }
            goto LAB_00109d52;
          }
        }
        else {
          if (bVar3) {
            pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = "";
            }
            pcVar17 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar17 = "";
            }
            cVar9 = compare_file(this,file_index,files->m_size,pcVar15,pcVar17,local_170);
            goto LAB_00109cec;
          }
          pcVar15 = out_filename.m_pStr;
          if (out_filename.m_pStr == (char *)0x0) {
            pcVar15 = "";
          }
          bVar5 = read_only_file_check(this,pcVar15);
          if (bVar5) {
            pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = "";
            }
            pcVar17 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar17 = "";
            }
            cVar9 = convert_file(this,file_index,files->m_size,pcVar15,pcVar17,local_170);
            goto LAB_00109cec;
          }
          this->m_num_processed = this->m_num_processed + 1;
LAB_00109d2a:
          bVar6 = crnlib::command_line_params::get_value_as_bool(this_00,"ignoreerrors",0,false);
          bVar5 = true;
          if (bVar6) {
            crnlib::console::info("");
            this->m_num_failed = this->m_num_failed + 1;
LAB_00109d52:
            bVar5 = false;
          }
        }
      }
      else {
        pcVar15 = out_filename.m_pStr;
        if (out_filename.m_pStr == (char *)0x0) {
          pcVar15 = "";
        }
        bVar5 = crnlib::file_utils::does_file_exist(pcVar15);
        if (!bVar5) goto LAB_00109c1a;
        bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"nooverwrite",0,false);
        if (!bVar5) {
          bVar5 = crnlib::command_line_params::get_value_as_bool(this_00,"timestamp",0,false);
          if (bVar5) {
            pcVar15 = *(char **)((long)&(pfVar2->m_fullname).m_buf_size + local_168);
            if (pcVar15 == (char *)0x0) {
              pcVar15 = "";
            }
            pcVar17 = out_filename.m_pStr;
            if (out_filename.m_pStr == (char *)0x0) {
              pcVar17 = "";
            }
            bVar5 = crnlib::file_utils::is_older_than(pcVar15,pcVar17);
            if (bVar5) {
              pcVar15 = out_filename.m_pStr;
              if (out_filename.m_pStr == (char *)0x0) {
                pcVar15 = "";
              }
              crnlib::console::warning("Skipping up to date file: %s\n",pcVar15);
              goto LAB_00109ba6;
            }
          }
          goto LAB_00109c1a;
        }
        pcVar15 = out_filename.m_pStr;
        if (out_filename.m_pStr == (char *)0x0) {
          pcVar15 = "";
        }
        crnlib::console::warning("Skipping already existing file: %s\n",pcVar15);
LAB_00109ba6:
        this->m_num_skipped = this->m_num_skipped + 1;
        bVar5 = false;
      }
      crnlib::dynamic_string::~dynamic_string(&out_filename);
    }
    crnlib::dynamic_string::~dynamic_string(&fmt);
    crnlib::dynamic_string::~dynamic_string(&in_ext);
    crnlib::dynamic_string::~dynamic_string(&in_fname);
    crnlib::dynamic_string::~dynamic_string(&in_path);
    crnlib::dynamic_string::~dynamic_string(&in_drive);
    if (bVar5) break;
    local_168 = local_168 + 0x48;
  }
  return uVar1 <= uVar13;
}

Assistant:

bool process_files(find_files::file_desc_vec& files)
    {
        const bool compare_mode = m_params.get_value_as_bool("compare");
        const bool info_mode = m_params.get_value_as_bool("info");

        for (uint32 file_index = 0; file_index < files.size(); file_index++)
        {
            const find_files::file_desc& file_desc = files[file_index];
            const dynamic_string& in_filename = file_desc.m_fullname;

            dynamic_string in_drive, in_path, in_fname, in_ext;
            file_utils::split_path(in_filename.get_ptr(), &in_drive, &in_path, &in_fname, &in_ext);

            texture_file_types::format out_file_type = texture_file_types::cFormatCRN;
            dynamic_string fmt;
            if (m_params.get_value_as_string("fileformat", 0, fmt))
            {
                if (fmt == "tga")
                {
                    out_file_type = texture_file_types::cFormatTGA;
                }
                else if (fmt == "bmp")
                {
                    out_file_type = texture_file_types::cFormatBMP;
                }
                else if (fmt == "dds")
                {
                    out_file_type = texture_file_types::cFormatDDS;
                }
                else if (fmt == "ktx")
                {
                    out_file_type = texture_file_types::cFormatKTX;
                }
                else if (fmt == "crn")
                {
                    out_file_type = texture_file_types::cFormatCRN;
                }
                else if (fmt == "png")
                {
                    out_file_type = texture_file_types::cFormatPNG;
                }
                else
                {
                    console::error("Unsupported output file type: %s", fmt.get_ptr());
                    return false;
                }
            }

            // No explicit output format has been specified - try to determine something doable.
            if (!m_params.has_key("fileformat"))
            {
                if (m_params.has_key("split"))
                {
                    out_file_type = texture_file_types::cFormatPNG;
                }
                else
                {
                    texture_file_types::format input_file_type = texture_file_types::determine_file_format(in_filename.get_ptr());
                    if (input_file_type == texture_file_types::cFormatCRN)
                    {
                        out_file_type = texture_file_types::cFormatDDS;
                        cfile_stream in_stream;
                        crnd::crn_header in_header;
                        if (in_stream.open(in_filename.get_ptr()) && in_stream.read(&in_header, sizeof(in_header)) == sizeof(in_header) &&
                            (in_header.m_format == cCRNFmtETC1 || in_header.m_format == cCRNFmtETC2 || in_header.m_format == cCRNFmtETC2A || in_header.m_format == cCRNFmtETC1S || in_header.m_format == cCRNFmtETC2AS))
                        {
                            out_file_type = texture_file_types::cFormatKTX;
                        }
                    }
                    else if (input_file_type == texture_file_types::cFormatKTX)
                    {
                        // Default to converting KTX files to PNG
                        out_file_type = texture_file_types::cFormatPNG;
                    }
                }
            }

            dynamic_string out_filename;
            if (m_params.get_value_as_bool("outsamedir"))
            {
                out_filename.format("%s%s%s.%s", in_drive.get_ptr(), in_path.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
            }
            else if (m_params.has_key("out"))
            {
                out_filename = m_params.get_value_as_string_or_empty("out");

                if (files.size() > 1)
                {
                    dynamic_string out_drive, out_dir, out_name, out_ext;
                    file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_dir, &out_name, &out_ext);

                    out_name.format("%s_%u", out_name.get_ptr(), file_index);

                    out_filename.format("%s%s%s%s", out_drive.get_ptr(), out_dir.get_ptr(), out_name.get_ptr(), out_ext.get_ptr());
                }

                if (!m_params.has_key("fileformat"))
                {
                    out_file_type = texture_file_types::determine_file_format(out_filename.get_ptr());
                }
            }
            else
            {
                dynamic_string out_dir(m_params.get_value_as_string_or_empty("outdir"));

                if (m_params.get_value_as_bool("recreate") && file_desc.m_rel.get_len())
                {
                    file_utils::combine_path(out_dir, out_dir.get_ptr(), file_desc.m_rel.get_ptr());
                }

                if (out_dir.get_len())
                {
                    if (file_utils::is_path_separator(out_dir.back()))
                    {
                        out_filename.format("%s%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                    }
                    else
                    {
                        out_filename.format("%s\\%s.%s", out_dir.get_ptr(), in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                    }
                }
                else
                {
                    out_filename.format("%s.%s", in_fname.get_ptr(), texture_file_types::get_extension(out_file_type));
                }

                if (m_params.get_value_as_bool("recreate"))
                {
                    if (file_utils::full_path(out_filename))
                    {
                        if ((!compare_mode) && (!info_mode))
                        {
                            dynamic_string out_drive, out_path;
                            file_utils::split_path(out_filename.get_ptr(), &out_drive, &out_path, nullptr, nullptr);
                            out_drive += out_path;
                            file_utils::create_path(out_drive.get_ptr());
                        }
                    }
                }
            }

            if ((!compare_mode) && (!info_mode))
            {
                if (file_utils::does_file_exist(out_filename.get_ptr()))
                {
                    if (m_params.get_value_as_bool("nooverwrite"))
                    {
                        console::warning("Skipping already existing file: %s\n", out_filename.get_ptr());
                        m_num_skipped++;
                        continue;
                    }

                    if (m_params.get_value_as_bool("timestamp"))
                    {
                        if (file_utils::is_older_than(in_filename.get_ptr(), out_filename.get_ptr()))
                        {
                            console::warning("Skipping up to date file: %s\n", out_filename.get_ptr());
                            m_num_skipped++;
                            continue;
                        }
                    }
                }
            }

            convert_status status = cCSFailed;

            if (info_mode)
            {
                status = display_file_info(file_index, files.size(), in_filename.get_ptr());
            }
            else if (compare_mode)
            {
                status = compare_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
            }
            else if (read_only_file_check(out_filename.get_ptr()))
            {
                status = convert_file(file_index, files.size(), in_filename.get_ptr(), out_filename.get_ptr(), out_file_type);
            }

            m_num_processed++;

            switch (status)
            {
                case cCSSucceeded: {
                    console::info("");
                    m_num_succeeded++;
                    break;
                }
                case cCSSkipped: {
                    console::info("Skipping file.\n");
                    m_num_skipped++;
                    break;
                }
                case cCSBadParam: {
                    return false;
                }
                default: {
                    if (!m_params.get_value_as_bool("ignoreerrors"))
                        return false;

                    console::info("");

                    m_num_failed++;
                    break;
                }
            }
        }

        return true;
    }